

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_448ecb::Db::parseTemplateArg(Db *this)

{
  char *pcVar1;
  Node **ppNVar2;
  Node **ppNVar3;
  Node *in_RAX;
  Node *pNVar4;
  char cVar5;
  Node NVar6;
  Node *Arg;
  Node *local_28;
  
  pcVar1 = this->First;
  if (this->Last == pcVar1) {
    cVar5 = '\0';
  }
  else {
    cVar5 = *pcVar1;
  }
  if (cVar5 == 'J') {
    this->First = pcVar1 + 1;
    ppNVar2 = (this->Names).Last;
    ppNVar3 = (this->Names).First;
    local_28 = in_RAX;
    while( true ) {
      pcVar1 = this->First;
      if ((pcVar1 != this->Last) && (*pcVar1 == 'E')) {
        this->First = pcVar1 + 1;
        NVar6 = (Node)popTrailingNodeArray(this,(long)ppNVar2 - (long)ppNVar3 >> 3);
        pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar4->K = KTemplateArgumentPack;
        pNVar4->RHSComponentCache = No;
        pNVar4->ArrayCache = No;
        pNVar4->FunctionCache = No;
        pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00208700;
        pNVar4[1] = NVar6;
        return pNVar4;
      }
      local_28 = parseTemplateArg(this);
      if (local_28 == (Node *)0x0) break;
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_28);
    }
  }
  else {
    if (cVar5 == 'L') {
      if (((ulong)((long)this->Last - (long)pcVar1) < 2) || (pcVar1[1] != 'Z')) {
        pNVar4 = parseExprPrimary(this);
        return pNVar4;
      }
      this->First = pcVar1 + 2;
      pNVar4 = parseEncoding(this);
    }
    else {
      if (cVar5 != 'X') {
        pNVar4 = parseType(this);
        return pNVar4;
      }
      this->First = pcVar1 + 1;
      pNVar4 = parseExpr(this);
    }
    if (((pNVar4 != (Node *)0x0) && (pcVar1 = this->First, pcVar1 != this->Last)) &&
       (*pcVar1 == 'E')) {
      this->First = pcVar1 + 1;
      return pNVar4;
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseTemplateArg() {
  switch (look()) {
  case 'X': {
    ++First;
    Node *Arg = parseExpr();
    if (Arg == nullptr || !consumeIf('E'))
      return nullptr;
    return Arg;
  }
  case 'J': {
    ++First;
    size_t ArgsBegin = Names.size();
    while (!consumeIf('E')) {
      Node *Arg = parseTemplateArg();
      if (Arg == nullptr)
        return nullptr;
      Names.push_back(Arg);
    }
    NodeArray Args = popTrailingNodeArray(ArgsBegin);
    return make<TemplateArgumentPack>(Args);
  }
  case 'L': {
    //                ::= LZ <encoding> E           # extension
    if (look(1) == 'Z') {
      First += 2;
      Node *Arg = parseEncoding();
      if (Arg == nullptr || !consumeIf('E'))
        return nullptr;
      return Arg;
    }
    //                ::= <expr-primary>            # simple expressions
    return parseExprPrimary();
  }
  default:
    return parseType();
  }
}